

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.cpp
# Opt level: O3

void test_qclab_qgates_PointerGate1<float>(void)

{
  float *pfVar1;
  float fVar2;
  void *pvVar3;
  char cVar4;
  internal iVar5;
  byte bVar6;
  int iVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type_conflict j;
  long lVar11;
  pointer *__ptr;
  undefined8 *puVar12;
  undefined1 uVar13;
  long lVar14;
  char *pcVar15;
  char *in_R9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  vector<int,_std::allocator<int>_> qubits;
  PointerGate1<float> P_1;
  PointerGate1<float> PX;
  PointerGate1<float> P;
  PointerGate1<float> PZ;
  PauliZ<float> Z;
  stringstream qasm2;
  PauliX<float> X2;
  stringstream qasm;
  PauliX<float> X;
  undefined1 local_410 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  pointer local_400;
  undefined1 local_3f8 [8];
  undefined8 local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  AssertHelper local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  AssertHelper *local_3c8;
  AssertHelper local_3c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3b8;
  internal local_3b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  undefined **local_3a0;
  undefined4 local_398;
  undefined4 uStack_394;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  _Alloc_hider local_388;
  undefined8 local_380;
  AssertHelper *local_378;
  AssertHelper local_370;
  undefined4 local_368;
  undefined1 local_360 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [7];
  ios_base aiStack_2e0 [264];
  AssertHelper local_1d8;
  undefined4 local_1d0;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [7];
  ios_base local_148 [264];
  undefined **local_40;
  undefined4 local_38;
  
  local_38 = 0;
  local_40 = &PTR_nbQubits_004e9f00;
  _local_398 = 0;
  local_3a0 = &PTR_nbQubits_004ec4d0;
  local_360._0_4_ = 1;
  local_3f8._0_4_ = 1;
  local_390._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )&local_40;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.nbQubits()","1",(int *)local_360,(int *)local_3f8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xd,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  cVar4 = (*(code *)(*(undefined ***)
                      local_390._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[1])();
  local_360[0] = (internal)cVar4;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_360,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xe,(char *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  iVar7 = (*(code *)(*(undefined ***)
                      local_390._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[3])();
  local_360._0_4_ = iVar7 + uStack_394;
  local_3f8 = (undefined1  [8])((ulong)local_3f8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.qubit()","0",(int *)local_360,(int *)local_3f8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x10,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_360._0_4_ = uStack_394;
  local_3f8 = (undefined1  [8])((ulong)local_3f8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.offset()","0",(int *)local_360,(int *)local_3f8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x11,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_360 = (undefined1  [8])
              local_390._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
  local_3f8 = (undefined1  [8])&local_40;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1c8,"P.ptr()","&X",(QGate1<float> **)local_360,
             (PauliX<float> **)local_3f8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x12,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_360 != (undefined1  [8])0x0) {
      (*(code *)(*(undefined ***)local_360)[1])();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_1c8._0_4_ = (**(code **)((long)local_3a0 + 0x18))();
  __l._M_len = 1;
  __l._M_array = (iterator)local_1c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_410,__l,(allocator_type *)local_360);
  local_360 = (undefined1  [8])((long)local_408 - (long)local_410 >> 2);
  local_3f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1c8,"qubits.size()","1",(unsigned_long *)local_360,(int *)local_3f8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x16,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_360 = (undefined1  [8])((ulong)local_360 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"qubits[0]","0",(int *)local_410,(int *)local_360);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x17,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  (*(code *)(*(undefined ***)
              local_390._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl)[7])(local_1c8);
  puVar9 = (undefined8 *)operator_new__(0x10);
  *puVar9 = 0x3f80000000000000;
  puVar9[1] = 0x3f800000;
  if (CONCAT44(local_1c8._4_4_,local_1c8._0_4_) == 2) {
    lVar11 = 0;
    pbVar10 = local_1c0;
    puVar12 = puVar9;
    do {
      lVar14 = 0;
      do {
        fVar2 = *(float *)((long)puVar12 + lVar14 * 4);
        pfVar1 = (float *)((long)&(pbVar10->_M_dataplus)._M_p + lVar14 * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_002470b6;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 2);
      lVar11 = lVar11 + 1;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar10->_M_string_length;
      puVar12 = puVar12 + 1;
      uVar13 = 1;
    } while (lVar11 != 2);
  }
  else {
LAB_002470b6:
    uVar13 = 0;
  }
  local_360[0] = (internal)uVar13;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  operator_delete__(puVar9);
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0);
  }
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_360,
               (AssertionResult *)"P.matrix() == X.matrix()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1a,(char *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  uVar8 = (*(code *)(*(undefined ***)
                      local_390._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[0xb])
                    (local_390._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,local_1b8,uStack_394);
  local_3f8._0_4_ = uVar8;
  local_3d8.data_ = (AssertHelperData *)((ulong)local_3d8.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.toQASM( qasm )","0",(int *)local_3f8,(int *)&local_3d8);
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1e,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_3f8,"qasm.str()","\"x q[0];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
             (char (*) [9])0x438379);
  if (local_360 != (undefined1  [8])local_350) {
    operator_delete((void *)local_360,local_350[0]._M_allocated_capacity + 1);
  }
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1f,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_360 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  uStack_394 = 3;
  local_3f8._0_4_ = 3;
  local_3d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.offset()","3",(int *)local_3f8,(int *)&local_3d8);
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x23,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  iVar7 = (*(code *)(*(undefined ***)
                      local_390._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[3])();
  local_3f8._0_4_ = iVar7 + uStack_394;
  local_3d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.qubit()","3",(int *)local_3f8,(int *)&local_3d8);
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x24,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3f8 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  uVar8 = (**(code **)((long)local_3a0 + 0x18))();
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_3d8;
  local_3d8.data_._0_4_ = uVar8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_360,__l_00,(allocator_type *)&local_388);
  local_3d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3f8,"P.qubits()[0]","3",(int *)local_360,(int *)&local_3d8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_360 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_360,local_350[0]._M_allocated_capacity - (long)local_360);
  }
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x25,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_360);
  uVar8 = (*(code *)(*(undefined ***)
                      local_390._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[0xb])
                    (local_390._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,local_350,uStack_394);
  local_3d8.data_._0_4_ = uVar8;
  local_388._M_p = (pointer)((ulong)local_388._M_p._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3f8,"P.toQASM( qasm2 )","0",(int *)&local_3d8,(int *)&local_388);
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x27,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_388,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
    if (local_3d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3d8.data_ + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&local_3d8,"qasm2.str()","\"x q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
             (char (*) [9])"x q[3];\n");
  if (local_3f8 != (undefined1  [8])&local_3e8) {
    operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
  }
  if (local_3d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_3d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_3d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x28,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_388,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3f8 + 8))();
    }
  }
  if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,local_3d0);
  }
  iVar5 = (internal)
          (**(code **)((long)local_3a0 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_3a0,&local_40);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3d8.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P == X","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2b,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if ((long *)local_388._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_388._M_p + 8))();
    }
    if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d0,local_3d0);
    }
  }
  local_3d8.data_._0_1_ =
       (internal)
       (**(code **)((long)local_3a0 + 0x70))
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_3a0,&local_40);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P != X","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2c,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if ((long *)local_388._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_388._M_p + 8))();
    }
    if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d0,local_3d0);
    }
  }
  local_368 = 0;
  local_370.data_ = (AssertHelperData *)&PTR_nbQubits_004eb260;
  bVar6 = (**(code **)((long)local_3a0 + 0x70))();
  local_3d8.data_._0_1_ = (internal)(bVar6 ^ 1);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar6 != 0) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P != Z","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2e,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if ((long *)local_388._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_388._M_p + 8))();
    }
    if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d0,local_3d0);
    }
  }
  cVar4 = (**(code **)((long)local_3a0 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_3a0,&local_370);
  local_3d8.data_ = (AssertHelperData *)(CONCAT71(local_3d8.data_._1_7_,cVar4) ^ 1);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P == Z","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2f,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if ((long *)local_388._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_388._M_p + 8))();
    }
    if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d0,local_3d0);
    }
  }
  local_3c8 = &local_1d8;
  local_1d0 = 0;
  local_1d8.data_ = (AssertHelperData *)&PTR_nbQubits_004e9f00;
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3d8.data_ = (AssertHelperData *)&PTR_nbQubits_004ec4d0;
  local_380 = 0;
  local_388._M_p = (pointer)&PTR_nbQubits_004ec4d0;
  local_378 = &local_370;
  local_3b0[0] = (internal)(**(code **)((long)local_3a0 + 0x70))();
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_3b0,(AssertionResult *)"P == PX","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x33,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
  }
  local_3b0[0] = (internal)
                 (**(code **)((long)local_3a0 + 0x70))
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_3a0,&local_3d8);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_3b0,(AssertionResult *)"P != PX","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x34,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
  }
  bVar6 = (**(code **)((long)local_3a0 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_3a0,&local_388);
  local_3b0[0] = (internal)(bVar6 ^ 1);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar6 != 0) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_3b0,(AssertionResult *)"P != PZ","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x35,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
  }
  bVar6 = (**(code **)((long)local_3a0 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_3a0,&local_388);
  local_3b0[0] = (internal)(bVar6 ^ 1);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar6 != 0) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_3b0,(AssertionResult *)"P == PZ","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x36,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_360);
  std::ios_base::~ios_base(aiStack_2e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  std::ios_base::~ios_base(local_148);
  if (local_410 != (undefined1  [8])0x0) {
    operator_delete((void *)local_410,(long)local_400 - (long)local_410);
  }
  local_398 = 5;
  local_3a0 = &PTR_nbQubits_004e9f00;
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3f8 = (undefined1  [8])&PTR_nbQubits_004ec4d0;
  local_360._0_4_ = 1;
  local_410._0_4_ = 1;
  local_3e8._M_allocated_capacity =
       (size_type)
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_3a0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.nbQubits()","1",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3d,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  cVar4 = (**(code **)(*local_3e8._M_allocated_capacity + 8))();
  local_360[0] = (internal)cVar4;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_360,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3e,(char *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  iVar7 = (**(code **)(*local_3e8._M_allocated_capacity + 0x18))();
  local_360._0_4_ = iVar7 + local_3f0._4_4_;
  local_410._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.qubit()","5",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x40,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  iVar7 = (*(code *)(((string *)((long)local_3f8 + 0x18))->_M_dataplus)._M_p)();
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_410;
  local_410._0_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1c8,__l_01,(allocator_type *)&local_3d8);
  local_410._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.qubits()[0]","5",
             (int *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),(int *)local_410);
  pvVar3 = (void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1b8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x41,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  local_360._0_4_ = local_3f0._4_4_;
  local_410 = (undefined1  [8])((ulong)local_410 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.offset()","0",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x42,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_360 = (undefined1  [8])local_3e8._M_allocated_capacity;
  local_410 = (undefined1  [8])&local_3a0;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1c8,"P.ptr()","&X",(QGate1<float> **)local_360,
             (PauliX<float> **)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x43,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  uVar8 = (**(code **)(*local_3e8._M_allocated_capacity + 0x58))
                    (local_3e8._M_allocated_capacity,local_1b8,local_3f0._4_4_);
  local_410._0_4_ = uVar8;
  local_3d8.data_ = local_3d8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.toQASM( qasm )","0",(int *)local_410,(int *)&local_3d8);
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_410);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x47,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_410,"qasm.str()","\"x q[5];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
             (char (*) [9])"x q[5];\n");
  if (local_360 != (undefined1  [8])local_350) {
    operator_delete((void *)local_360,local_350[0]._M_allocated_capacity + 1);
  }
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x48,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  std::ios_base::~ios_base(local_148);
  _local_398 = _local_398 & 0xffffffff00000000;
  local_3a0 = &PTR_nbQubits_004e9f00;
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000000;
  local_3f8 = (undefined1  [8])&PTR_nbQubits_004ec4d0;
  local_360._0_4_ = 1;
  local_410._0_4_ = 1;
  local_3e8._M_allocated_capacity =
       (size_type)
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_3a0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.nbQubits()","1",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x4f,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  cVar4 = (**(code **)(*local_3e8._M_allocated_capacity + 8))();
  local_360[0] = (internal)cVar4;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_360,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x50,(char *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  iVar7 = (**(code **)(*local_3e8._M_allocated_capacity + 0x18))();
  local_360._0_4_ = iVar7 + local_3f0._4_4_;
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.qubit()","3",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x52,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  iVar7 = (*(code *)(((string *)((long)local_3f8 + 0x18))->_M_dataplus)._M_p)();
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_410;
  local_410._0_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1c8,__l_02,(allocator_type *)&local_3d8);
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.qubits()[0]","3",
             (int *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),(int *)local_410);
  pvVar3 = (void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1b8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x53,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  local_360._0_4_ = local_3f0._4_4_;
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.offset()","3",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x54,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_360 = (undefined1  [8])local_3e8._M_allocated_capacity;
  local_410 = (undefined1  [8])&local_3a0;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1c8,"P.ptr()","&X",(QGate1<float> **)local_360,
             (PauliX<float> **)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x55,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  uVar8 = (**(code **)(*local_3e8._M_allocated_capacity + 0x58))
                    (local_3e8._M_allocated_capacity,local_1b8,local_3f0._4_4_);
  local_410._0_4_ = uVar8;
  local_3d8.data_ = local_3d8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.toQASM( qasm )","0",(int *)local_410,(int *)&local_3d8);
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_410);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x59,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_410,"qasm.str()","\"x q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
             (char (*) [9])"x q[3];\n");
  if (local_360 != (undefined1  [8])local_350) {
    operator_delete((void *)local_360,local_350[0]._M_allocated_capacity + 1);
  }
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x5a,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  std::ios_base::~ios_base(local_148);
  local_398 = 4;
  local_3a0 = &PTR_nbQubits_004e9f00;
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000000;
  local_3f8 = (undefined1  [8])&PTR_nbQubits_004ec4d0;
  local_360._0_4_ = 1;
  local_410._0_4_ = 1;
  local_3e8._M_allocated_capacity =
       (size_type)
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_3a0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.nbQubits()","1",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x61,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  cVar4 = (**(code **)(*local_3e8._M_allocated_capacity + 8))();
  local_360[0] = (internal)cVar4;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_360,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x62,(char *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  iVar7 = (**(code **)(*local_3e8._M_allocated_capacity + 0x18))();
  local_360._0_4_ = iVar7 + local_3f0._4_4_;
  local_410._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.qubit()","7",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,100,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  iVar7 = (*(code *)(((string *)((long)local_3f8 + 0x18))->_M_dataplus)._M_p)();
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_410;
  local_410._0_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1c8,__l_03,(allocator_type *)&local_3d8);
  local_410._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.qubits()[0]","7",
             (int *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),(int *)local_410);
  pvVar3 = (void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1b8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x65,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  local_360._0_4_ = local_3f0._4_4_;
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"P.offset()","3",(int *)local_360,(int *)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x66,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_360 = (undefined1  [8])local_3e8._M_allocated_capacity;
  local_410 = (undefined1  [8])&local_3a0;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1c8,"P.ptr()","&X",(QGate1<float> **)local_360,
             (PauliX<float> **)local_410);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x67,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  uVar8 = (**(code **)(*local_3e8._M_allocated_capacity + 0x58))
                    (local_3e8._M_allocated_capacity,local_1b8,local_3f0._4_4_);
  local_410._0_4_ = uVar8;
  local_3d8.data_ = local_3d8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_360,"P.toQASM( qasm )","0",(int *)local_410,(int *)&local_3d8);
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_410);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_358->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x6b,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358,local_358);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_410,"qasm.str()","\"x q[7];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
             (char (*) [9])"x q[7];\n");
  if (local_360 != (undefined1  [8])local_350) {
    operator_delete((void *)local_360,local_350[0]._M_allocated_capacity + 1);
  }
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_360);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x6c,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_360 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_360 + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  std::ios_base::~ios_base(local_148);
  return;
}

Assistant:

void test_qclab_qgates_PointerGate1() {

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 0 ) ;      // qubit
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // qubits
    auto qubits = P.qubits() ;
    EXPECT_EQ( qubits.size() , 1 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;

    // matrix
    EXPECT_TRUE( P.matrix() == X.matrix() ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\n" ) ;

    // setOffset
    P.setOffset( 3 ) ;
    EXPECT_EQ( P.offset() , 3 ) ;
    EXPECT_EQ( P.qubit() , 3 ) ;
    EXPECT_EQ( P.qubits()[0] , 3 ) ;
    std::stringstream qasm2 ;
    EXPECT_EQ( P.toQASM( qasm2 ) , 0 ) ;
    EXPECT_EQ( qasm2.str() , "x q[3];\n" ) ;

    // operators == and !=
    EXPECT_TRUE(  P == X ) ;
    EXPECT_FALSE( P != X ) ;
    qclab::qgates::PauliZ< T >  Z ;
    EXPECT_TRUE(  P != Z ) ;
    EXPECT_FALSE( P == Z ) ;
    qclab::qgates::PauliX< T >  X2 ;
    qclab::qgates::PointerGate1< T > PX( &X2 ) ;
    qclab::qgates::PointerGate1< T > PZ( &Z ) ;
    EXPECT_TRUE(  P == PX ) ;
    EXPECT_FALSE( P != PX ) ;
    EXPECT_TRUE(  P != PZ ) ;
    EXPECT_FALSE( P == PZ ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 5 ) ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 5 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 5 ) ;  // qubits
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[5];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 3 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 3 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[3];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 4 ) ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 7 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 7 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[7];\n" ) ;
  }

}